

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

bool __thiscall
gguf_reader::read<char>(gguf_reader *this,vector<char,_std::allocator<char>_> *dst,size_t n)

{
  size_t sVar1;
  pointer pcVar2;
  ulong uVar3;
  bool bVar4;
  
  std::vector<char,_std::allocator<char>_>::resize(dst,n);
  pcVar2 = (dst->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((dst->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish == pcVar2) {
    bVar4 = true;
  }
  else {
    uVar3 = 0;
    do {
      sVar1 = fread(pcVar2 + uVar3,1,1,(FILE *)this->file);
      bVar4 = sVar1 == 1;
      if (!bVar4) {
        return bVar4;
      }
      uVar3 = uVar3 + 1;
      pcVar2 = (dst->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(dst->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pcVar2));
  }
  return bVar4;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }